

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

void test_text(void)

{
  int iVar1;
  int line;
  int *piVar2;
  int in_ECX;
  char *address;
  int in_EDX;
  int family;
  int sock;
  int in_ESI;
  int option;
  void *in_R9;
  int opt;
  uint8_t bad [20];
  size_t in_stack_fffffffffffffba8;
  undefined4 local_44c;
  undefined4 local_448;
  undefined1 local_444;
  undefined1 local_428 [1032];
  
  iVar1 = test_socket_impl((char *)0x2e,in_ESI,in_EDX,in_ECX);
  line = test_socket_impl((char *)0x2f,in_ESI,family,in_ECX);
  nn_sleep(200);
  local_44c = 1;
  option = (int)&local_44c;
  test_setsockopt_impl((char *)0x35,iVar1,-4,1,option,in_R9,in_stack_fffffffffffffba8);
  local_44c = 1;
  test_setsockopt_impl((char *)0x37,line,-4,1,option,in_R9,in_stack_fffffffffffffba8);
  local_44c = 500;
  address = (char *)0x5;
  test_setsockopt_impl((char *)0x39,iVar1,0,5,option,in_R9,in_stack_fffffffffffffba8);
  test_bind_impl((char *)0x3b,iVar1,0x1060e0,address);
  test_connect_impl((char *)0x3c,line,sock,address);
  test_send_impl((char *)0x3e,line,0x103105,address);
  test_recv_impl((char *)0x3f,iVar1,0x103105,address);
  local_444 = 0;
  local_448 = 0x2edd4142;
  test_send_impl((char *)0x44,line,(int)&local_448,address);
  iVar1 = nn_recv(iVar1,local_428,0x400,0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x6e) goto LAB_00101f7f;
  }
  if (iVar1 < 0) {
    return;
  }
  test_text_cold_2();
LAB_00101f7f:
  test_text_cold_1();
}

Assistant:

void test_text() {

    int sb;
    int sc;
    int opt;
    uint8_t bad[20];

    /*  Negative testing... bad UTF-8 data for text. */
    sb = test_socket (AF_SP, NN_PAIR);
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Wait for connects to establish. */
    nn_sleep (200);

    opt = NN_WS_MSG_TYPE_TEXT;
    test_setsockopt(sb, NN_WS, NN_WS_MSG_TYPE, &opt, sizeof (opt));
    opt = NN_WS_MSG_TYPE_TEXT;
    test_setsockopt(sc, NN_WS, NN_WS_MSG_TYPE, &opt, sizeof (opt));
    opt = 500;
    test_setsockopt(sb, NN_SOL_SOCKET, NN_RCVTIMEO, &opt, sizeof (opt));

    test_bind (sb, socket_address);
    test_connect (sc, socket_address);

    test_send (sc, "GOOD");
    test_recv (sb, "GOOD");

    /*  and the bad ... */
    strcpy((char *)bad, "BAD.");
    bad[2] = (char)0xDD;
    test_send (sc, (char *)bad);

    /*  Make sure we dropped the frame. */
    test_drop (sb, ETIMEDOUT);
}